

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlslangToSpv.cpp
# Opt level: O2

MemoryAccessMask __thiscall
anon_unknown.dwarf_a4b191::TGlslangToSpvTraverser::TranslateMemoryAccess
          (TGlslangToSpvTraverser *this,CoherentFlags *coherentFlags)

{
  ushort uVar1;
  MemoryAccessMask MVar2;
  
  MVar2 = MaskNone;
  if (this->glslangIntermediate->useVulkanMemoryModel == true) {
    uVar1 = *(ushort *)coherentFlags;
    if ((uVar1 >> 9 & 1) == 0) {
      MVar2 = MakePointerVisible|MakePointerAvailable;
      if ((uVar1 & 0xbf) == 0) {
        MVar2 = uVar1 & 0xbf;
      }
      MVar2 = uVar1 >> 7 & MemoryAccessVolatileMask |
              uVar1 >> 1 & MemoryAccessNonPrivatePointerKHRMask | MVar2;
      if ((uVar1 >> 8 & 1) == 0) {
        if (MVar2 == MaskNone) {
          return MaskNone;
        }
      }
      else {
        MVar2 = MVar2 | MemoryAccessNontemporalMask;
      }
      spv::Builder::addCapability(&this->builder,CapabilityVulkanMemoryModel);
    }
  }
  return MVar2;
}

Assistant:

spv::MemoryAccessMask TGlslangToSpvTraverser::TranslateMemoryAccess(
    const spv::Builder::AccessChain::CoherentFlags &coherentFlags)
{
    spv::MemoryAccessMask mask = spv::MemoryAccessMaskNone;

    if (!glslangIntermediate->usingVulkanMemoryModel() || coherentFlags.isImage)
        return mask;

    if (coherentFlags.isVolatile() || coherentFlags.anyCoherent()) {
        mask = mask | spv::MemoryAccessMakePointerAvailableKHRMask |
                      spv::MemoryAccessMakePointerVisibleKHRMask;
    }

    if (coherentFlags.nonprivate) {
        mask = mask | spv::MemoryAccessNonPrivatePointerKHRMask;
    }
    if (coherentFlags.volatil) {
        mask = mask | spv::MemoryAccessVolatileMask;
    }
    if (coherentFlags.nontemporal) {
        mask = mask | spv::MemoryAccessNontemporalMask;
    }
    if (mask != spv::MemoryAccessMaskNone) {
        builder.addCapability(spv::CapabilityVulkanMemoryModelKHR);
    }

    return mask;
}